

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 UVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  U64 UVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  byte *pbVar11;
  BYTE *pBVar12;
  uint local_3cc;
  uint local_364;
  byte local_360;
  byte local_35c;
  uint local_358;
  U32 mls;
  U32 rowMask;
  U32 rowLog;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  U32 bound;
  U32 kMaxMatchEndPositionsToUpdate;
  U32 kMaxMatchStartPositionsToUpdate;
  U32 kSkipThreshold;
  U32 target;
  BYTE *base;
  U32 idx;
  U32 pos;
  BYTE *tagRow;
  U32 *row;
  U32 relRow;
  U32 hash;
  BYTE *base_1;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 pos_1;
  BYTE *tagRow_1;
  U32 *row_3;
  U32 relRow_1;
  U32 hash_3;
  BYTE *base_2;
  U32 hashLog_2;
  BYTE *tagTable_2;
  U32 *hashTable_2;
  uint local_23c;
  U32 row_2;
  U32 hash_2;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  U32 hash_4;
  U32 row_4;
  U32 newHash_1;
  U32 hash_1;
  U32 row_1;
  U32 newHash;
  ulong local_d8;
  uint local_b8;
  U32 next_1;
  U32 next;
  
  if ((ms->cParams).searchLog < 6) {
    local_358 = (ms->cParams).searchLog;
  }
  else {
    local_358 = 6;
  }
  if (local_358 < 4) {
    local_35c = 4;
  }
  else {
    if ((ms->cParams).searchLog < 6) {
      local_360 = (byte)(ms->cParams).searchLog;
    }
    else {
      local_360 = 6;
    }
    local_35c = local_360;
  }
  uVar6 = (1 << (local_35c & 0x1f)) - 1;
  if ((ms->cParams).minMatch < 6) {
    local_364 = (ms->cParams).minMatch;
  }
  else {
    local_364 = 6;
  }
  local_23c = ms->nextToUpdate;
  uVar7 = (int)ip - (int)(ms->window).base;
  if (local_23c <= uVar7) {
    pUVar2 = ms->hashTable;
    pBVar3 = ms->tagTable;
    UVar1 = ms->rowHashLog;
    pBVar4 = (ms->window).base;
    while( true ) {
      if (uVar7 <= local_23c) {
        ms->nextToUpdate = uVar7;
        return;
      }
      pBVar12 = pBVar4 + local_23c;
      uVar8 = UVar1 + 8;
      UVar5 = ms->hashSalt;
      if (0x20 < uVar8) break;
      switch(local_364) {
      default:
        sVar10 = ZSTD_hash4PtrS(pBVar12,uVar8,(U32)UVar5);
        local_b8 = (uint)sVar10;
        break;
      case 5:
        sVar10 = ZSTD_hash5PtrS(pBVar12,uVar8,UVar5);
        local_b8 = (uint)sVar10;
        break;
      case 6:
        sVar10 = ZSTD_hash6PtrS(pBVar12,uVar8,UVar5);
        local_b8 = (uint)sVar10;
        break;
      case 7:
        sVar10 = ZSTD_hash7PtrS(pBVar12,uVar8,UVar5);
        local_b8 = (uint)sVar10;
        break;
      case 8:
        sVar10 = ZSTD_hash8PtrS(pBVar12,uVar8,UVar5);
        local_b8 = (uint)sVar10;
      }
      uVar8 = (local_b8 >> 8) << (local_35c & 0x1f);
      pbVar11 = pBVar3 + uVar8;
      uVar9 = *pbVar11 - 1 & uVar6;
      local_3cc = uVar6;
      if (uVar9 != 0) {
        local_3cc = 0;
      }
      local_3cc = local_3cc + uVar9;
      *pbVar11 = (byte)local_3cc;
      pBVar12 = pBVar4 + local_23c;
      uVar9 = UVar1 + 8;
      UVar5 = ms->hashSalt;
      if (0x20 < uVar9) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
      }
      switch(local_364) {
      default:
        local_d8 = ZSTD_hash4PtrS(pBVar12,uVar9,(U32)UVar5);
        break;
      case 5:
        local_d8 = ZSTD_hash5PtrS(pBVar12,uVar9,UVar5);
        break;
      case 6:
        local_d8 = ZSTD_hash6PtrS(pBVar12,uVar9,UVar5);
        break;
      case 7:
        local_d8 = ZSTD_hash7PtrS(pBVar12,uVar9,UVar5);
        break;
      case 8:
        local_d8 = ZSTD_hash8PtrS(pBVar12,uVar9,UVar5);
      }
      if (local_b8 != local_d8) {
        __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x375,
                      "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                     );
      }
      pbVar11[local_3cc] = (byte)local_b8;
      pUVar2[(ulong)uVar8 + (ulong)local_3cc] = local_23c;
      local_23c = local_23c + 1;
    }
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
  }
  __assert_fail("target >= idx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                ,0x397,
                "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
               );
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}